

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode
JsVarSerializerSetTransferableVars
          (JsVarSerializerHandle serializerHandle,JsValueRef *transferableVars,
          size_t transferableVarsCount)

{
  code *pcVar1;
  bool bVar2;
  JsErrorCode JVar3;
  JsrtContext *currentContext;
  undefined4 *puVar4;
  ChakraCoreStreamWriter *streamWriter;
  AutoNestedHandledExceptionType local_58 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (serializerHandle == (JsVarSerializerHandle)0x0) {
    JVar3 = JsErrorNullArgument;
  }
  else {
    currentContext = JsrtContext::GetCurrent();
    JVar3 = CheckContext(currentContext,false,false);
    if (JVar3 == JsNoError) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      JVar3 = ChakraCoreStreamWriter::SetTransferableVars
                        ((ChakraCoreStreamWriter *)serializerHandle,transferableVars,
                         transferableVarsCount);
      if ((((JVar3 - JsErrorNoCurrentContext < 7) &&
           ((0x43U >> (JVar3 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) ||
          (JVar3 == JsErrorOutOfMemory)) ||
         ((JVar3 == JsErrorFatal || ((JVar3 & 0xfffffffd) == JsErrorScriptException)))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                           ,0x11f,
                           "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated)"
                           ,
                           "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
    }
  }
  return JVar3;
}

Assistant:

CHAKRA_API
JsVarSerializerSetTransferableVars(
    _In_ JsVarSerializerHandle serializerHandle,
    _In_opt_ JsValueRef *transferableVars,
    _In_ size_t transferableVarsCount)
{
    PARAM_NOT_NULL(serializerHandle);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraCoreStreamWriter* streamWriter = reinterpret_cast<ChakraCoreStreamWriter*>(serializerHandle);
        return streamWriter->SetTransferableVars(transferableVars, transferableVarsCount);
    });

}